

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O0

void __thiscall FluxTrackBuilder::addRawBit(FluxTrackBuilder *this,bool next_bit)

{
  int local_2c;
  value_type_conflict2 local_1c;
  int local_18;
  byte local_11;
  int pre_comp_ns;
  bool next_bit_local;
  FluxTrackBuilder *this_local;
  
  this->m_flux_time = this->m_bitcell_ns + this->m_flux_time;
  local_11 = next_bit;
  if ((this->m_curr_bit & 1U) != 0) {
    _pre_comp_ns = this;
    if (*(int *)&(this->super_TrackBuilder).field_0x14 < 0x28) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_flux_times,&this->m_flux_time);
      this->m_flux_time = 0;
    }
    else {
      if ((bool)(this->m_last_bit & 1U) == next_bit) {
        local_2c = 0;
      }
      else {
        local_2c = -0xf0;
        if ((this->m_last_bit & 1U) != 0) {
          local_2c = 0xf0;
        }
      }
      local_18 = local_2c;
      local_1c = this->m_flux_time + local_2c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_flux_times,&local_1c);
      this->m_flux_time = -local_18;
    }
  }
  this->m_last_bit = (bool)(this->m_curr_bit & 1);
  this->m_curr_bit = (bool)(local_11 & 1);
  return;
}

Assistant:

void FluxTrackBuilder::addRawBit(bool next_bit)
{
    m_flux_time += m_bitcell_ns;

    if (m_curr_bit)
    {
        if (m_cylhead.cyl < 40)
        {
            m_flux_times.push_back(m_flux_time);
            m_flux_time = 0;
        }
        else
        {
            // Move adjacent transitions further apart, to account for attraction when written.
            auto pre_comp_ns{ (m_last_bit == next_bit) ? 0 : (m_last_bit ? +PRECOMP_NS : -PRECOMP_NS) };

            m_flux_times.push_back(m_flux_time + pre_comp_ns);
            m_flux_time = 0 - pre_comp_ns;
        }
    }

    m_last_bit = m_curr_bit;
    m_curr_bit = next_bit;
}